

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirQuantileState<duckdb::hugeint_t>::FillReservoir
          (ReservoirQuantileState<duckdb::hugeint_t> *this,idx_t sample_size,hugeint_t element)

{
  ulong uVar1;
  hugeint_t *phVar2;
  hugeint_t local_10;
  
  local_10.upper = element.upper;
  local_10.lower = element.lower;
  uVar1 = this->pos;
  if (uVar1 < sample_size) {
    phVar2 = this->v;
    this->pos = uVar1 + 1;
    phVar2[uVar1].lower = local_10.lower;
    phVar2[uVar1].upper = local_10.upper;
    BaseReservoirSampling::InitializeReservoirWeights(this->r_samp,this->pos,this->len);
    return;
  }
  if (this->r_samp->next_index_to_sample == this->r_samp->num_entries_to_skip_b4_next_sample) {
    ReplaceElement(this,&local_10);
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}